

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O2

void keccakf(void *state)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  
  local_c8 = *state;
  uVar7 = *(ulong *)((long)state + 8);
  uVar23 = *(ulong *)((long)state + 0x28);
  local_d8 = *(ulong *)((long)state + 0x50);
  uVar2 = *(ulong *)((long)state + 0x78);
  local_90 = *(ulong *)((long)state + 0xa0);
  local_80 = *(ulong *)((long)state + 0x30);
  uVar17 = *(ulong *)((long)state + 0x58);
  local_e0 = *(ulong *)((long)state + 0x80);
  local_88 = *(ulong *)((long)state + 0xa8);
  uVar21 = *(ulong *)((long)state + 0x10);
  local_f8 = *(ulong *)((long)state + 0x38);
  local_100 = *(ulong *)((long)state + 0x60);
  uVar18 = *(ulong *)((long)state + 0x88);
  uVar5 = *(ulong *)((long)state + 0xb0);
  local_c0 = *(ulong *)((long)state + 0x18);
  uVar15 = *(ulong *)((long)state + 0x40);
  local_d0 = *(ulong *)((long)state + 0x68);
  local_98 = *(ulong *)((long)state + 0x90);
  local_110 = *(ulong *)((long)state + 0xb8);
  local_f0 = *(ulong *)((long)state + 0x20);
  local_e8 = *(ulong *)((long)state + 0x48);
  local_108 = *(ulong *)((long)state + 0x70);
  uVar20 = *(ulong *)((long)state + 0x98);
  uVar10 = *(ulong *)((long)state + 0xc0);
  for (lVar6 = 0; lVar6 != 0xc0; lVar6 = lVar6 + 8) {
    uVar14 = local_d8 ^ uVar2 ^ uVar23 ^ local_c8 ^ local_90;
    uVar11 = uVar17 ^ local_e0 ^ local_80 ^ uVar7 ^ local_88;
    uVar3 = local_d0 ^ local_98 ^ uVar15 ^ local_c0 ^ local_110;
    uVar26 = local_108 ^ uVar20 ^ local_e8 ^ local_f0 ^ uVar10;
    uVar22 = (uVar3 << 1 | (ulong)((long)uVar3 < 0)) ^ uVar11;
    uVar12 = (uVar11 << 1 | (ulong)((long)uVar11 < 0)) ^ uVar26;
    local_c8 = local_c8 ^ uVar12;
    uVar11 = uVar23 ^ uVar12;
    uVar13 = uVar12 ^ local_90;
    uVar23 = local_100 ^ uVar18 ^ local_f8 ^ uVar21 ^ uVar5;
    uVar27 = (uVar26 << 1 | (ulong)((long)uVar26 < 0)) ^ uVar23;
    uVar24 = (uVar23 << 1 | (ulong)((long)uVar23 < 0)) ^ uVar14;
    uVar26 = uVar7 ^ uVar24;
    uVar9 = uVar17 ^ uVar24;
    uVar1 = uVar21 ^ uVar22;
    uVar17 = local_f8 ^ uVar22;
    uVar3 = (uVar14 << 1 | (ulong)((long)uVar14 < 0)) ^ uVar3;
    uVar14 = local_f0 ^ uVar3;
    uVar23 = local_c0 ^ uVar27;
    uVar21 = (local_98 ^ uVar27) << 0x15 | (local_98 ^ uVar27) >> 0x2b;
    local_f0 = (uVar3 ^ uVar10) << 0xe | (uVar3 ^ uVar10) >> 0x32;
    uVar16 = (local_100 ^ uVar22) << 0x2b | (local_100 ^ uVar22) >> 0x15;
    uVar19 = (local_80 ^ uVar24) << 0x2c | (local_80 ^ uVar24) >> 0x14;
    uVar7 = ~uVar16 & uVar21 ^ uVar19;
    local_c0 = ~local_f0 & local_c8 ^ uVar21;
    uVar21 = ~uVar21 & local_f0 ^ uVar16;
    local_f0 = ~local_c8 & uVar19 ^ local_f0;
    uVar4 = (uVar15 ^ uVar27) << 0x37 | (uVar15 ^ uVar27) >> 9;
    uVar10 = (uVar24 ^ local_88) << 2 | (uVar24 ^ local_88) >> 0x3e;
    uVar8 = (uVar2 ^ uVar12) << 0x29 | (uVar2 ^ uVar12) >> 0x17;
    uVar1 = uVar1 << 0x3e | uVar1 >> 2;
    uVar25 = (local_108 ^ uVar3) << 0x27 | (local_108 ^ uVar3) >> 0x19;
    local_90 = ~uVar4 & uVar25 ^ uVar1;
    local_88 = ~uVar25 & uVar8 ^ uVar4;
    local_c8 = local_c8 ^ ~uVar19 & uVar16 ^ *(ulong *)((long)RC + lVar6);
    uVar2 = (local_d8 ^ uVar12) << 3 | (local_d8 ^ uVar12) >> 0x3d;
    uVar16 = uVar23 << 0x1c | uVar23 >> 0x24;
    uVar12 = (local_e0 ^ uVar24) << 0x2d | (local_e0 ^ uVar24) >> 0x13;
    uVar19 = (uVar22 ^ uVar5) << 0x3d | (uVar22 ^ uVar5) >> 3;
    uVar5 = (local_e8 ^ uVar3) << 0x14 | (local_e8 ^ uVar3) >> 0x2c;
    uVar15 = ~uVar19 & uVar16 ^ uVar12;
    local_f8 = ~uVar12 & uVar19 ^ uVar2;
    uVar23 = ~uVar5 & uVar2 ^ uVar16;
    local_80 = ~uVar2 & uVar12 ^ uVar5;
    uVar26 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
    uVar2 = uVar17 << 6 | uVar17 >> 0x3a;
    uVar17 = (uVar20 ^ uVar3) << 8 | (uVar20 ^ uVar3) >> 0x38;
    uVar20 = (local_d0 ^ uVar27) << 0x19 | (local_d0 ^ uVar27) >> 0x27;
    local_e8 = ~uVar16 & uVar5 ^ uVar19;
    local_108 = uVar13 << 0x12 | uVar13 >> 0x2e;
    local_100 = ~uVar17 & local_108 ^ uVar20;
    local_d0 = ~local_108 & uVar26 ^ uVar17;
    local_d8 = ~uVar2 & uVar20 ^ uVar26;
    uVar17 = ~uVar20 & uVar17 ^ uVar2;
    local_108 = ~uVar26 & uVar2 ^ local_108;
    uVar26 = uVar9 << 10 | uVar9 >> 0x36;
    uVar5 = (uVar18 ^ uVar22) << 0xf | (uVar18 ^ uVar22) >> 0x31;
    uVar11 = uVar11 << 0x24 | uVar11 >> 0x1c;
    uVar14 = uVar14 << 0x1b | uVar14 >> 0x25;
    uVar20 = (uVar27 ^ local_110) << 0x38 | (uVar27 ^ local_110) >> 8;
    local_98 = ~uVar20 & uVar14 ^ uVar5;
    uVar18 = ~uVar5 & uVar20 ^ uVar26;
    uVar2 = ~uVar11 & uVar26 ^ uVar14;
    local_e0 = ~uVar26 & uVar5 ^ uVar11;
    uVar20 = ~uVar14 & uVar11 ^ uVar20;
    local_110 = ~uVar10 & uVar1 ^ uVar8;
    uVar5 = ~uVar8 & uVar10 ^ uVar25;
    uVar10 = ~uVar1 & uVar4 ^ uVar10;
  }
  *(ulong *)state = local_c8;
  *(ulong *)((long)state + 0x28) = uVar23;
  *(ulong *)((long)state + 0x50) = local_d8;
  *(ulong *)((long)state + 0x78) = uVar2;
  *(ulong *)((long)state + 0xa0) = local_90;
  *(ulong *)((long)state + 8) = uVar7;
  *(ulong *)((long)state + 0x30) = local_80;
  *(ulong *)((long)state + 0x58) = uVar17;
  *(ulong *)((long)state + 0x80) = local_e0;
  *(ulong *)((long)state + 0xa8) = local_88;
  *(ulong *)((long)state + 0x10) = uVar21;
  *(ulong *)((long)state + 0x38) = local_f8;
  *(ulong *)((long)state + 0x60) = local_100;
  *(ulong *)((long)state + 0x88) = uVar18;
  *(ulong *)((long)state + 0xb0) = uVar5;
  *(ulong *)((long)state + 0x18) = local_c0;
  *(ulong *)((long)state + 0x40) = uVar15;
  *(ulong *)((long)state + 0x68) = local_d0;
  *(ulong *)((long)state + 0x90) = local_98;
  *(ulong *)((long)state + 0xb8) = local_110;
  *(ulong *)((long)state + 0x20) = local_f0;
  *(ulong *)((long)state + 0x48) = local_e8;
  *(ulong *)((long)state + 0x70) = local_108;
  *(ulong *)((long)state + 0x98) = uVar20;
  *(ulong *)((long)state + 0xc0) = uVar10;
  return;
}

Assistant:

static inline void keccakf(void* state) {
  uint64_t* a = (uint64_t*)state;
  uint64_t b[5] = {0};
  uint64_t t = 0;
  uint8_t x, y;

  for (int i = 0; i < 24; i++) {
    // Theta
    FOR5(x, 1, b[x] = 0; FOR5(y, 5, b[x] ^= a[x + y];))
    FOR5(x, 1, FOR5(y, 5, a[y + x] ^= b[(x + 4) % 5] ^ rol(b[(x + 1) % 5], 1);))
    // Rho and pi
    t = a[1];
    x = 0;
    REPEAT24(b[0] = a[pi[x]]; a[pi[x]] = rol(t, rho[x]); t = b[0]; x++;)
    // Chi
    FOR5(y, 5,
         FOR5(x, 1, b[x] = a[y + x];) FOR5(
             x, 1, a[y + x] = b[x] ^ ((~b[(x + 1) % 5]) & b[(x + 2) % 5]);))
    // Iota
    a[0] ^= RC[i];
  }
}